

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i32_Store_(w3Interp *this)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t a;
  w3Interp *this_local;
  
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  puVar2 = (uint32_t *)LoadStore(this,4);
  *puVar2 = uVar1;
  return;
}

Assistant:

INTERP (i32_Store_)
{
    const uint32_t a = pop_u32 ();
    *(uint32_t*)LoadStore (4) = a;
}